

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O1

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isTypeIntegerOrContainsIntegers
               (VarType *varType)

{
  Type TVar1;
  DataType DVar2;
  pointer pSVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  VarType *varType_00;
  uint uVar8;
  
  for (; TVar1 = varType->m_type, TVar1 == TYPE_ARRAY; varType = (varType->m_data).array.elementType
      ) {
  }
  if (TVar1 == TYPE_BASIC) {
    DVar2 = (varType->m_data).basic.type;
    bVar6 = true;
    if (3 < DVar2 - TYPE_INT) {
      bVar6 = DVar2 - TYPE_UINT < 4;
    }
  }
  else if (TVar1 == TYPE_STRUCT) {
    pSVar3 = (((varType->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (int)((long)(((varType->m_data).structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) * -0x49249249
    ;
    bVar6 = 0 < (int)uVar8;
    if ((0 < (int)uVar8) && (bVar5 = isTypeIntegerOrContainsIntegers(&pSVar3->m_type), !bVar5)) {
      varType_00 = &pSVar3[1].m_type;
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        if ((uVar8 & 0x7fffffff) == uVar7) break;
        bVar6 = isTypeIntegerOrContainsIntegers(varType_00);
        varType_00 = (VarType *)&varType_00[2].m_data;
        uVar4 = uVar7 + 1;
      } while (!bVar6);
      bVar6 = uVar7 < (uVar8 & 0x7fffffff);
    }
  }
  else {
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

static bool isTypeIntegerOrContainsIntegers (const glu::VarType& varType)
{
	if (varType.isBasicType())
		return glu::isDataTypeIntOrIVec(varType.getBasicType()) || glu::isDataTypeUintOrUVec(varType.getBasicType());
	else if (varType.isArrayType())
		return isTypeIntegerOrContainsIntegers(varType.getElementType());
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isTypeIntegerOrContainsIntegers(varType.getStructPtr()->getMember(ndx).getType()))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}